

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpnSave.c
# Opt level: O2

Npn_Obj_t * Npn_ManAdd(Npn_Man_t *p,word uTruth)

{
  int iVar1;
  Npn_Obj_t *pNVar2;
  int *piVar3;
  int iVar4;
  
  iVar4 = p->nBins;
  iVar1 = p->nEntries;
  if (iVar1 == p->nBufferSize) {
    p->nBufferSize = iVar1 * 2;
    if (p->pBuffer == (Npn_Obj_t *)0x0) {
      pNVar2 = (Npn_Obj_t *)malloc((long)iVar1 << 5);
    }
    else {
      pNVar2 = (Npn_Obj_t *)realloc(p->pBuffer,(long)iVar1 << 5);
    }
    p->pBuffer = pNVar2;
  }
  iVar4 = (int)((uTruth * 0x6f1 ^ uTruth * 0x2dd ^ uTruth * 0x65) % (ulong)(long)iVar4);
  pNVar2 = Npn_ManObj(p,p->pBins[iVar4]);
  piVar3 = p->pBins + iVar4;
  while( true ) {
    if (pNVar2 == (Npn_Obj_t *)0x0) {
      iVar4 = p->nEntries;
      *piVar3 = iVar4;
      if (iVar4 < p->nBufferSize) {
        p->nEntries = iVar4 + 1;
        pNVar2 = Npn_ManObj(p,iVar4);
        pNVar2->uTruth = uTruth;
        pNVar2->Count = 1;
        pNVar2->iNext = 0;
        if (p->nBins * 3 < p->nEntries) {
          Npn_ManResize(p);
        }
        return pNVar2;
      }
      __assert_fail("p->nEntries < p->nBufferSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcNpnSave.c"
                    ,0x1cc,"Npn_Obj_t *Npn_ManAdd(Npn_Man_t *, word)");
    }
    if (pNVar2->uTruth == uTruth) break;
    piVar3 = &pNVar2->iNext;
    pNVar2 = Npn_ManObj(p,pNVar2->iNext);
  }
  pNVar2->Count = pNVar2->Count + 1;
  return pNVar2;
}

Assistant:

Npn_Obj_t * Npn_ManAdd( Npn_Man_t * p, word uTruth )
{
    Npn_Obj_t * pEntry;
    int * pPlace, Key = Npn_ManHash( p, uTruth );
    // resize the link storage if needed
    if ( p->nEntries == p->nBufferSize )
    {
        p->nBufferSize *= 2;
        p->pBuffer = ABC_REALLOC( Npn_Obj_t, p->pBuffer, p->nBufferSize );
    }
    // find the entry
    for ( pEntry = Npn_ManObj(p, p->pBins[Key]), 
          pPlace = p->pBins + Key; 
          pEntry; 
          pPlace = &pEntry->iNext, 
          pEntry = Npn_ManObj(p, pEntry->iNext) )
        if ( pEntry->uTruth == uTruth )
        {
            pEntry->Count++;
            return pEntry;
        }
    // create new entry
    *pPlace = p->nEntries;
    assert( p->nEntries < p->nBufferSize );
    pEntry = Npn_ManObj( p, p->nEntries++ );
    pEntry->uTruth = uTruth;
    pEntry->Count = 1;
    pEntry->iNext = 0;
    // resize the table if needed
    if ( p->nEntries > 3 * p->nBins )
        Npn_ManResize( p );
    return pEntry;
}